

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O1

void __thiscall
WAVEFRONT::BuildMesh::NodeTriangle
          (BuildMesh *this,GeometryVertex *v1,GeometryVertex *v2,GeometryVertex *v3,bool textured)

{
  IntVector *this_00;
  iterator iVar1;
  float *pfVar2;
  undefined3 in_register_00000081;
  int local_34;
  int local_30;
  int local_2c;
  
  this_00 = &this->mIndices;
  pfVar2 = (float *)0x0;
  if (CONCAT31(in_register_00000081,textured) != 0) {
    pfVar2 = v1->mTexel;
  }
  local_2c = GetIndex(this,v1->mPos,pfVar2);
  iVar1._M_current =
       (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_2c);
  }
  else {
    *iVar1._M_current = local_2c;
    (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  pfVar2 = (float *)0x0;
  if (textured) {
    pfVar2 = v2->mTexel;
  }
  local_30 = GetIndex(this,v2->mPos,pfVar2);
  iVar1._M_current =
       (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = local_30;
    (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  pfVar2 = (float *)0x0;
  if (textured) {
    pfVar2 = v3->mTexel;
  }
  local_34 = GetIndex(this,v3->mPos,pfVar2);
  iVar1._M_current =
       (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_34);
  }
  else {
    *iVar1._M_current = local_34;
    (this->mIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

virtual void NodeTriangle(const GeometryVertex *v1,const GeometryVertex *v2,const GeometryVertex *v3, bool textured)
	{
		mIndices.push_back( GetIndex(v1->mPos, textured ? v1->mTexel : NULL) );
		mIndices.push_back( GetIndex(v2->mPos, textured ? v2->mTexel : NULL) );
		mIndices.push_back( GetIndex(v3->mPos, textured ? v3->mTexel : NULL) );
	}